

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js.h
# Opt level: O0

void __thiscall wasm::ABI::wasm2js::ensureHelpers(wasm2js *this,Module *wasm,IString specific)

{
  IString str;
  IString str_00;
  initializer_list<wasm::Type> types;
  IString str_01;
  initializer_list<wasm::Type> types_00;
  IString str_02;
  initializer_list<wasm::Type> types_01;
  IString str_03;
  initializer_list<wasm::Type> types_02;
  IString str_04;
  initializer_list<wasm::Type> types_03;
  IString str_05;
  initializer_list<wasm::Type> types_04;
  IString str_06;
  initializer_list<wasm::Type> types_05;
  IString str_07;
  IString str_08;
  initializer_list<wasm::Type> types_06;
  IString str_09;
  IString str_10;
  initializer_list<wasm::Type> types_07;
  IString str_11;
  initializer_list<wasm::Type> types_08;
  IString str_12;
  Type local_448;
  Type local_440;
  size_t local_438;
  char *local_430;
  string_view local_428;
  Type local_418;
  Type local_410;
  size_t local_408;
  char *local_400;
  string_view local_3f8;
  Type local_3e8;
  Type local_3e0 [6];
  iterator local_3b0;
  undefined8 local_3a8;
  Type local_3a0;
  size_t local_398;
  char *local_390;
  string_view local_388;
  Type local_378;
  Type local_370 [5];
  iterator local_348;
  undefined8 local_340;
  Type local_338;
  size_t local_330;
  char *local_328;
  string_view local_320;
  Type local_310;
  Type local_308;
  iterator local_300;
  undefined8 local_2f8;
  Type local_2f0;
  size_t local_2e8;
  char *local_2e0;
  string_view local_2d8;
  Type local_2c8;
  Type local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  iterator local_2a8;
  undefined8 local_2a0;
  Type local_298;
  size_t local_290;
  char *local_288;
  string_view local_280;
  Type local_270;
  Type local_268;
  undefined8 local_260;
  undefined8 local_258;
  iterator local_250;
  undefined8 local_248;
  Type local_240;
  size_t local_238;
  char *local_230;
  string_view local_228;
  Type local_218;
  Type local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  iterator local_1f0;
  undefined8 local_1e8;
  Type local_1e0;
  size_t local_1d8;
  char *local_1d0;
  string_view local_1c8;
  Type local_1b8;
  Type local_1b0;
  iterator local_1a8;
  undefined8 local_1a0;
  Type local_198;
  size_t local_190;
  char *local_188;
  string_view local_180;
  Type local_170;
  Type local_168;
  size_t local_160;
  char *local_158;
  string_view local_150;
  Type local_140;
  Type local_138;
  iterator local_130;
  undefined8 local_128;
  Type local_120;
  size_t local_118;
  char *local_110;
  string_view local_108;
  Type local_f8;
  Type local_f0;
  size_t local_e8;
  char *local_e0;
  string_view local_d8;
  Type local_c8;
  Type local_c0;
  Type TStack_b8;
  iterator local_b0;
  undefined8 local_a8;
  Type local_a0;
  size_t local_98;
  char *local_90;
  string_view local_88;
  Type local_78;
  Type local_70;
  iterator local_68;
  undefined8 local_60;
  Type local_58;
  size_t local_50;
  char *local_48;
  string_view local_40;
  undefined1 local_30 [8];
  anon_class_16_2_b3eb4c27 ensureImport;
  Module *wasm_local;
  IString specific_local;
  
  specific_local.str._M_len = specific.str._M_len;
  local_30 = (undefined1  [8])&ensureImport.specific;
  ensureImport.wasm = &wasm_local;
  local_50 = SCRATCH_LOAD_I32;
  local_48 = DAT_027e6188;
  str_12.str._M_str = DAT_027e6188;
  str_12.str._M_len = SCRATCH_LOAD_I32;
  ensureImport.specific = (IString *)this;
  wasm_local = wasm;
  wasm::Name::Name((Name *)&local_40,str_12);
  wasm::Type::Type(&local_70,i32);
  local_68 = &local_70;
  local_60 = 1;
  types_08._M_len = 1;
  types_08._M_array = local_68;
  wasm::Type::Type(&local_58,types_08);
  wasm::Type::Type(&local_78,i32);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_40,local_58,local_78);
  local_98 = SCRATCH_STORE_I32;
  local_90 = DAT_027e6198;
  str_11.str._M_str = DAT_027e6198;
  str_11.str._M_len = SCRATCH_STORE_I32;
  wasm::Name::Name((Name *)&local_88,str_11);
  wasm::Type::Type(&local_c0,i32);
  wasm::Type::Type(&TStack_b8,i32);
  local_b0 = &local_c0;
  local_a8 = 2;
  types_07._M_len = 2;
  types_07._M_array = local_b0;
  wasm::Type::Type(&local_a0,types_07);
  wasm::Type::Type(&local_c8,none);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_88,local_a0,local_c8);
  local_e8 = SCRATCH_LOAD_F32;
  local_e0 = DAT_027e61a8;
  str_10.str._M_str = DAT_027e61a8;
  str_10.str._M_len = SCRATCH_LOAD_F32;
  wasm::Name::Name((Name *)&local_d8,str_10);
  wasm::Type::Type(&local_f0);
  wasm::Type::Type(&local_f8,f32);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_d8,local_f0,local_f8);
  local_118 = SCRATCH_STORE_F32;
  local_110 = DAT_027e61b8;
  str_09.str._M_str = DAT_027e61b8;
  str_09.str._M_len = SCRATCH_STORE_F32;
  wasm::Name::Name((Name *)&local_108,str_09);
  wasm::Type::Type(&local_138,f32);
  local_130 = &local_138;
  local_128 = 1;
  types_06._M_len = 1;
  types_06._M_array = local_130;
  wasm::Type::Type(&local_120,types_06);
  wasm::Type::Type(&local_140,none);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_108,local_120,local_140);
  local_160 = SCRATCH_LOAD_F64;
  local_158 = DAT_027e61c8;
  str_08.str._M_str = DAT_027e61c8;
  str_08.str._M_len = SCRATCH_LOAD_F64;
  wasm::Name::Name((Name *)&local_150,str_08);
  wasm::Type::Type(&local_168);
  wasm::Type::Type(&local_170,f64);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_150,local_168,local_170);
  local_190 = SCRATCH_STORE_F64;
  local_188 = DAT_027e61d8;
  str_07.str._M_str = DAT_027e61d8;
  str_07.str._M_len = SCRATCH_STORE_F64;
  wasm::Name::Name((Name *)&local_180,str_07);
  wasm::Type::Type(&local_1b0,f64);
  local_1a8 = &local_1b0;
  local_1a0 = 1;
  types_05._M_len = 1;
  types_05._M_array = local_1a8;
  wasm::Type::Type(&local_198,types_05);
  wasm::Type::Type(&local_1b8,none);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_180,local_198,local_1b8);
  local_1d8 = MEMORY_INIT;
  local_1d0 = DAT_027e61e8;
  str_06.str._M_str = DAT_027e61e8;
  str_06.str._M_len = MEMORY_INIT;
  wasm::Name::Name((Name *)&local_1c8,str_06);
  local_210.id = 2;
  local_208 = 2;
  local_200 = 2;
  local_1f8 = 2;
  local_1f0 = &local_210;
  local_1e8 = 4;
  types_04._M_len = 4;
  types_04._M_array = local_1f0;
  wasm::Type::Type(&local_1e0,types_04);
  wasm::Type::Type(&local_218,none);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_1c8,local_1e0,local_218);
  local_238 = MEMORY_FILL;
  local_230 = DAT_027e61f8;
  str_05.str._M_str = DAT_027e61f8;
  str_05.str._M_len = MEMORY_FILL;
  wasm::Name::Name((Name *)&local_228,str_05);
  local_268.id = 2;
  local_260 = 2;
  local_258 = 2;
  local_250 = &local_268;
  local_248 = 3;
  types_03._M_len = 3;
  types_03._M_array = local_250;
  wasm::Type::Type(&local_240,types_03);
  wasm::Type::Type(&local_270,none);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_228,local_240,local_270);
  local_290 = MEMORY_COPY;
  local_288 = DAT_027e6208;
  str_04.str._M_str = DAT_027e6208;
  str_04.str._M_len = MEMORY_COPY;
  wasm::Name::Name((Name *)&local_280,str_04);
  local_2c0.id = 2;
  local_2b8 = 2;
  local_2b0 = 2;
  local_2a8 = &local_2c0;
  local_2a0 = 3;
  types_02._M_len = 3;
  types_02._M_array = local_2a8;
  wasm::Type::Type(&local_298,types_02);
  wasm::Type::Type(&local_2c8,none);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_280,local_298,local_2c8);
  local_2e8 = DATA_DROP;
  local_2e0 = DAT_027e6218;
  str_03.str._M_str = DAT_027e6218;
  str_03.str._M_len = DATA_DROP;
  wasm::Name::Name((Name *)&local_2d8,str_03);
  wasm::Type::Type(&local_308,i32);
  local_300 = &local_308;
  local_2f8 = 1;
  types_01._M_len = 1;
  types_01._M_array = local_300;
  wasm::Type::Type(&local_2f0,types_01);
  wasm::Type::Type(&local_310,none);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_2d8,local_2f0,local_310);
  local_330 = ATOMIC_WAIT_I32;
  local_328 = DAT_027e6228;
  str_02.str._M_str = DAT_027e6228;
  str_02.str._M_len = ATOMIC_WAIT_I32;
  wasm::Name::Name((Name *)&local_320,str_02);
  memcpy(local_370,&DAT_020d9708,0x28);
  local_348 = local_370;
  local_340 = 5;
  types_00._M_len = 5;
  types_00._M_array = local_348;
  wasm::Type::Type(&local_338,types_00);
  wasm::Type::Type(&local_378,i32);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_320,local_338,local_378);
  local_398 = ATOMIC_RMW_I64;
  local_390 = DAT_027e6238;
  str_01.str._M_str = DAT_027e6238;
  str_01.str._M_len = ATOMIC_RMW_I64;
  wasm::Name::Name((Name *)&local_388,str_01);
  memcpy(local_3e0,&DAT_020d9730,0x30);
  local_3b0 = local_3e0;
  local_3a8 = 6;
  types._M_len = 6;
  types._M_array = local_3b0;
  wasm::Type::Type(&local_3a0,types);
  wasm::Type::Type(&local_3e8,i32);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_388,local_3a0,local_3e8);
  local_408 = GET_STASHED_BITS;
  local_400 = DAT_027e6248;
  str_00.str._M_str = DAT_027e6248;
  str_00.str._M_len = GET_STASHED_BITS;
  wasm::Name::Name((Name *)&local_3f8,str_00);
  wasm::Type::Type(&local_410);
  wasm::Type::Type(&local_418,i32);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_3f8,local_410,local_418);
  local_438 = TRAP;
  local_430 = DAT_027e6258;
  str.str._M_str = DAT_027e6258;
  str.str._M_len = TRAP;
  wasm::Name::Name((Name *)&local_428,str);
  wasm::Type::Type(&local_440);
  wasm::Type::Type(&local_448,none);
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_30,(Name)local_428,local_440,local_448);
  return;
}

Assistant:

inline void ensureHelpers(Module* wasm, IString specific = IString()) {
  auto ensureImport = [&](Name name, Type params, Type results) {
    if (wasm->getFunctionOrNull(name)) {
      return;
    }
    if (specific.is() && name != specific) {
      return;
    }
    auto func = Builder::makeFunction(name, Signature(params, results), {});
    func->module = ENV;
    func->base = name;
    wasm->addFunction(std::move(func));
  };

  ensureImport(SCRATCH_LOAD_I32, {Type::i32}, Type::i32);
  ensureImport(SCRATCH_STORE_I32, {Type::i32, Type::i32}, Type::none);
  ensureImport(SCRATCH_LOAD_F32, {}, Type::f32);
  ensureImport(SCRATCH_STORE_F32, {Type::f32}, Type::none);
  ensureImport(SCRATCH_LOAD_F64, {}, Type::f64);
  ensureImport(SCRATCH_STORE_F64, {Type::f64}, Type::none);
  ensureImport(
    MEMORY_INIT, {Type::i32, Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(MEMORY_FILL, {Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(MEMORY_COPY, {Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(DATA_DROP, {Type::i32}, Type::none);
  ensureImport(ATOMIC_WAIT_I32,
               {Type::i32, Type::i32, Type::i32, Type::i32, Type::i32},
               Type::i32);
  ensureImport(
    ATOMIC_RMW_I64,
    {Type::i32, Type::i32, Type::i32, Type::i32, Type::i32, Type::i32},
    Type::i32);
  ensureImport(GET_STASHED_BITS, {}, Type::i32);
  ensureImport(TRAP, {}, Type::none);
}